

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeVarArray<Js::VarArrayVarCount>
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  size_t sVar8;
  Var pvVar9;
  ulong uVar10;
  VarArrayVarCount *this_00;
  undefined8 local_40;
  int8 value;
  byte local_31 [8];
  byte code;
  
  uVar1 = *(uint *)buffer;
  uVar4 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar4 <= (ulong)uVar1 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1261,
                                "(serialized->offset + sizeof(T) < deserializeInto->GetLength())",
                                "serialized->offset + sizeof(T) < deserializeInto->GetLength()");
    if (!bVar3) goto LAB_007c6ee2;
    *puVar6 = 0;
  }
  pbVar7 = ByteBlock::GetBuffer(deserializeInto);
  uVar1 = *(uint *)(buffer + 5);
  this_00 = (VarArrayVarCount *)(pbVar7 + *(uint *)buffer);
  VarArrayVarCount::SetCount(this_00,uVar1);
  uVar5 = *(uint *)buffer;
  sVar8 = VarArrayVarCount::GetDataSize(this_00);
  uVar4 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar4 < sVar8 + uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1265,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar3) {
LAB_007c6ee2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pbVar7 = buffer + 9;
  uVar10 = 0;
  do {
    if (uVar1 == uVar10) {
      return pbVar7;
    }
    pbVar7 = ReadByte(this,pbVar7,local_31);
    switch(local_31[0]) {
    case 1:
      pbVar7 = ReadByte(this,pbVar7,(byte *)&local_40);
      uVar5 = (uint)(char)(byte)local_40;
      break;
    case 2:
      pbVar7 = ReadConstantSizedInt16(this,pbVar7,(int16 *)&local_40);
      uVar5 = (uint)CONCAT11(local_40._1_1_,(byte)local_40);
      break;
    case 3:
      pbVar7 = ReadConstantSizedInt32(this,pbVar7,(int *)&local_40);
      uVar5 = CONCAT22(local_40._2_2_,CONCAT11(local_40._1_1_,(byte)local_40));
      break;
    case 4:
      pbVar7 = ReadDouble(this,pbVar7,(double *)&local_40);
      pvVar9 = JavascriptNumber::ToVar
                         ((double)CONCAT44(local_40._4_4_,
                                           CONCAT22(local_40._2_2_,
                                                    CONCAT11(local_40._1_1_,(byte)local_40))));
      goto LAB_007c6e6d;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x1291,"((0))","Unexpected object type in VarArray");
      if (bVar3) {
        *puVar6 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      goto LAB_007c6ee2;
    }
    pvVar9 = (Var)((ulong)uVar5 | 0x1000000000000);
LAB_007c6e6d:
    this_00[uVar10 + 1].count = pvVar9;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

const byte * DeserializeVarArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const Js::SerializedVarArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxVarArray);
#endif
        Assert(serialized->offset + sizeof(T) < deserializeInto->GetLength());
        auto result = (T *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->varCount;
        result->SetCount(count);
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            byte code;
            current = ReadByte(current, &code);
            switch(code)
            {
                case ctInt32:
                    {
                        int value;
                        current = ReadConstantSizedInt32(current, &value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctInt16:
                    {
                        int16 value;
                        current = ReadConstantSizedInt16(current, &value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctInt8:
                    {
                        int8 value;
                        current = ReadByte(current, (byte *)&value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctNumber:
                    {
                        double value;
                        current = ReadDouble(current, &value);
                        const auto number = Js::JavascriptNumber::New(value, scriptContext);
#if !FLOATVAR
                        scriptContext->BindReference(number);
#endif
                        result->elements[index] = number;
                        break;
                    }

                default:
                    AssertMsg(UNREACHED, "Unexpected object type in VarArray");
                    Throw::FatalInternalError();
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxVarArray);
#endif
        return current;
    }